

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Bac_Man_t * Bac_PtrTransformToCba(Vec_Ptr_t *vDes)

{
  uint uVar1;
  Vec_Ptr_t *vNtk;
  void **ppvVar2;
  void *pvVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int NameId;
  int iVar7;
  int iVar8;
  int iVar9;
  Bac_Man_t *pBVar10;
  char *pcVar11;
  size_t sVar12;
  Abc_Nam_t *pAVar13;
  Bac_Ntk_t *pBVar14;
  Vec_Int_t *vMap;
  int *piVar15;
  Vec_Int_t *vBox2Id;
  void *pvVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  size_t sVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long local_68;
  int local_54;
  Bac_Man_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  uVar1 = vDes->nSize;
  sVar20 = (size_t)(int)uVar1;
  if ((long)sVar20 < 1) {
LAB_003c44f3:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pcVar17 = (char *)*vDes->pArray;
  pBVar10 = (Bac_Man_t *)calloc(1,0x530);
  pcVar11 = Extra_FileDesignName(pcVar17);
  pBVar10->pName = pcVar11;
  local_50 = pBVar10;
  if (pcVar17 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar17);
    pcVar11 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar11,pcVar17);
  }
  pBVar10 = local_50;
  local_50->pSpec = pcVar11;
  pAVar13 = Abc_NamStart(1000,0x18);
  pBVar10->pStrs = pAVar13;
  pAVar13 = Abc_NamStart(1000,0x18);
  pBVar10->pMods = pAVar13;
  pBVar10->iRoot = 1;
  pBVar10->nNtks = uVar1 - 1;
  pBVar14 = (Bac_Ntk_t *)calloc(sVar20,0xd0);
  pBVar10->pNtks = pBVar14;
  auVar6 = _DAT_0094e250;
  auVar5 = _DAT_0094e240;
  if (uVar1 - 1 != 0) {
    lVar21 = sVar20 - 2;
    auVar22._8_4_ = (int)lVar21;
    auVar22._0_8_ = lVar21;
    auVar22._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar18 = 0;
    auVar22 = auVar22 ^ _DAT_0094e250;
    do {
      auVar23._8_4_ = (int)uVar18;
      auVar23._0_8_ = uVar18;
      auVar23._12_4_ = (int)(uVar18 >> 0x20);
      auVar23 = (auVar23 | auVar5) ^ auVar6;
      if ((bool)(~(auVar23._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar23._0_4_ ||
                  auVar22._4_4_ < auVar23._4_4_) & 1)) {
        pBVar14[1].pDesign = pBVar10;
      }
      if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
          auVar23._12_4_ <= auVar22._12_4_) {
        pBVar14[2].pDesign = pBVar10;
      }
      uVar18 = uVar18 + 2;
      pBVar14 = pBVar14 + 2;
    } while ((uVar1 & 0x7ffffffe) != uVar18);
  }
  Bac_ManSetupTypes(pBVar10->pPrimNames,pBVar10->pPrimSymbs);
  vMap = (Vec_Int_t *)malloc(0x10);
  vMap->nCap = 1000;
  piVar15 = (int *)malloc(4000);
  vMap->pArray = piVar15;
  vMap->nSize = 1000;
  if (piVar15 != (int *)0x0) {
    memset(piVar15,0xff,4000);
  }
  vBox2Id = (Vec_Int_t *)malloc(0x10);
  vBox2Id->nCap = 1000;
  vBox2Id->nSize = 0;
  piVar15 = (int *)malloc(4000);
  vBox2Id->pArray = piVar15;
  iVar8 = pBVar10->nNtks;
  local_68 = 1;
  if (0 < iVar8) {
    lVar21 = 1;
    lVar19 = 0xd0;
    local_48 = vBox2Id;
    local_40 = vMap;
    do {
      if (vDes->nSize <= lVar21) goto LAB_003c44f3;
      vNtk = (Vec_Ptr_t *)vDes->pArray[lVar21];
      if ((vNtk->nSize < 2) || (local_38 = lVar21, vNtk->nSize == 2)) goto LAB_003c44f3;
      pBVar14 = pBVar10->pNtks;
      ppvVar2 = vNtk->pArray;
      pvVar16 = ppvVar2[1];
      pvVar3 = ppvVar2[2];
      NameId = Abc_NamStrFindOrAdd(pBVar10->pStrs,(char *)*ppvVar2,(int *)0x0);
      iVar8 = *(int *)((long)pvVar16 + 4);
      iVar9 = *(int *)((long)pvVar3 + 4);
      iVar7 = Ptr_ManCountNtk(vNtk);
      if (*(long *)((long)&pBVar14->pDesign + lVar19) == 0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)&(pBVar14->vInputs).nSize + lVar19) != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)&(pBVar14->vOutputs).nSize + lVar19) != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      *(int *)((long)&pBVar14->NameId + lVar19) = NameId;
      *(undefined8 *)((long)&pBVar14->iCopy + lVar19) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pBVar14->iBoxObj + lVar19) = 0xffffffff;
      if (*(int *)((long)&(pBVar14->vInputs).nCap + lVar19) < iVar8) {
        pvVar16 = *(void **)((long)&(pBVar14->vInputs).pArray + lVar19);
        if (pvVar16 == (void *)0x0) {
          pvVar16 = malloc((long)iVar8 << 2);
        }
        else {
          pvVar16 = realloc(pvVar16,(long)iVar8 << 2);
        }
        *(void **)((long)&(pBVar14->vInputs).pArray + lVar19) = pvVar16;
        if (pvVar16 == (void *)0x0) goto LAB_003c4512;
        *(int *)((long)&(pBVar14->vInputs).nCap + lVar19) = iVar8;
      }
      pBVar10 = local_50;
      if (*(int *)((long)&(pBVar14->vOutputs).nCap + lVar19) < iVar9) {
        pvVar16 = *(void **)((long)&(pBVar14->vOutputs).pArray + lVar19);
        if (pvVar16 == (void *)0x0) {
          pvVar16 = malloc((long)iVar9 << 2);
        }
        else {
          pvVar16 = realloc(pvVar16,(long)iVar9 << 2);
        }
        *(void **)((long)&(pBVar14->vOutputs).pArray + lVar19) = pvVar16;
        if (pvVar16 == (void *)0x0) goto LAB_003c4512;
        *(int *)((long)&(pBVar14->vOutputs).nCap + lVar19) = iVar9;
      }
      sVar20 = (size_t)iVar7;
      if (*(int *)((long)&(pBVar14->vType).nCap + lVar19) < iVar7) {
        pvVar16 = *(void **)((long)&(pBVar14->vType).pArray + lVar19);
        if (pvVar16 == (void *)0x0) {
          pvVar16 = malloc(sVar20);
        }
        else {
          pvVar16 = realloc(pvVar16,sVar20);
        }
        *(void **)((long)&(pBVar14->vType).pArray + lVar19) = pvVar16;
        *(int *)((long)&(pBVar14->vType).nCap + lVar19) = iVar7;
      }
      if (*(int *)((long)&(pBVar14->vFanin).nCap + lVar19) < iVar7) {
        pvVar16 = *(void **)((long)&(pBVar14->vFanin).pArray + lVar19);
        if (pvVar16 == (void *)0x0) {
          pvVar16 = malloc(sVar20 << 2);
        }
        else {
          pvVar16 = realloc(pvVar16,sVar20 << 2);
        }
        *(void **)((long)&(pBVar14->vFanin).pArray + lVar19) = pvVar16;
        if (pvVar16 == (void *)0x0) goto LAB_003c4512;
        *(int *)((long)&(pBVar14->vFanin).nCap + lVar19) = iVar7;
      }
      lVar21 = *(long *)((long)&pBVar14->pDesign + lVar19);
      pAVar13 = *(Abc_Nam_t **)(lVar21 + 0x18);
      pcVar17 = Abc_NamStr(*(Abc_Nam_t **)(lVar21 + 0x10),NameId);
      iVar8 = Abc_NamStrFindOrAdd(pAVar13,pcVar17,&local_54);
      lVar21 = *(long *)((long)&pBVar14->pDesign + lVar19);
      if (local_54 == 0) {
        iVar9 = (int)((ulong)((long)pBVar14 + (lVar19 - *(long *)(lVar21 + 0x28))) >> 4) *
                -0x3b13b13b;
        if ((iVar9 < 1) || (*(int *)(lVar21 + 0x24) < iVar9)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar8 != iVar9) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        Abc_NamStr(*(Abc_Nam_t **)(lVar21 + 0x10),NameId);
        printf("Network with name %s already exists.\n");
      }
      iVar8 = *(int *)((long)&(pBVar14->vType).nCap + lVar19);
      lVar21 = (long)iVar8;
      if (lVar21 == 0) {
        __assert_fail("Bac_NtkObjNumAlloc(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
      }
      if (*(int *)((long)&(pBVar14->vName).nCap + lVar19) < iVar8) {
        pvVar16 = *(void **)((long)&(pBVar14->vName).pArray + lVar19);
        if (pvVar16 == (void *)0x0) {
          pvVar16 = malloc(lVar21 * 4);
        }
        else {
          pvVar16 = realloc(pvVar16,lVar21 * 4);
        }
        *(void **)((long)&(pBVar14->vName).pArray + lVar19) = pvVar16;
        if (pvVar16 == (void *)0x0) {
LAB_003c4512:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)&(pBVar14->vName).nCap + lVar19) = iVar8;
      }
      if (0 < iVar8) {
        memset(*(void **)((long)&(pBVar14->vName).pArray + lVar19),0,lVar21 << 2);
      }
      vMap = local_40;
      vBox2Id = local_48;
      *(int *)((long)&(pBVar14->vName).nSize + lVar19) = iVar8;
      lVar21 = local_38 + 1;
      iVar8 = pBVar10->nNtks;
      lVar19 = lVar19 + 0xd0;
    } while (local_38 < iVar8);
    if (0 < iVar8) {
      lVar19 = 0xd0;
      lVar21 = 1;
      do {
        if (vDes->nSize <= lVar21) goto LAB_003c44f3;
        iVar9 = Bac_NtkDeriveFromPtr
                          ((Bac_Ntk_t *)((long)&pBVar10->pNtks->pDesign + lVar19),
                           (Vec_Ptr_t *)vDes->pArray[lVar21],vMap,vBox2Id);
        iVar8 = pBVar10->nNtks;
        local_68 = lVar21;
        if (iVar9 == 0) break;
        local_68 = lVar21 + 1;
        lVar19 = lVar19 + 0xd0;
        bVar4 = lVar21 < iVar8;
        lVar21 = local_68;
      } while (bVar4);
    }
  }
  if ((int)local_68 <= iVar8) {
    if (iVar8 != 0) {
      lVar21 = 0x198;
      lVar19 = 0;
      do {
        pBVar14 = pBVar10->pNtks;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0xa0);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0xa0) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0xa8) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x90);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x90) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x98) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x80);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x80) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x88) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x70);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x70) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x78) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x60);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x60) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x68) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x50);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x50) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x58) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x40);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x40) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x48) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x30);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x30) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x38) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x20);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x20) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x28) = 0;
        pvVar16 = *(void **)((long)pBVar14 + lVar21 + -0x10);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)pBVar14 + lVar21 + -0x10) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -0x18) = 0;
        pvVar16 = *(void **)((long)&pBVar14->pDesign + lVar21);
        if (pvVar16 != (void *)0x0) {
          free(pvVar16);
          *(undefined8 *)((long)&pBVar14->pDesign + lVar21) = 0;
        }
        *(undefined8 *)((long)pBVar14 + lVar21 + -8) = 0;
        lVar19 = lVar19 + 1;
        lVar21 = lVar21 + 0xd0;
      } while (lVar19 < pBVar10->nNtks);
    }
    piVar15 = (pBVar10->vBuf2LeafNtk).pArray;
    if (piVar15 != (int *)0x0) {
      free(piVar15);
      (pBVar10->vBuf2LeafNtk).pArray = (int *)0x0;
    }
    (pBVar10->vBuf2LeafNtk).nCap = 0;
    (pBVar10->vBuf2LeafNtk).nSize = 0;
    piVar15 = (pBVar10->vBuf2LeafObj).pArray;
    if (piVar15 != (int *)0x0) {
      free(piVar15);
      (pBVar10->vBuf2LeafObj).pArray = (int *)0x0;
    }
    (pBVar10->vBuf2LeafObj).nCap = 0;
    (pBVar10->vBuf2LeafObj).nSize = 0;
    piVar15 = (pBVar10->vBuf2RootNtk).pArray;
    if (piVar15 != (int *)0x0) {
      free(piVar15);
      (pBVar10->vBuf2RootNtk).pArray = (int *)0x0;
    }
    (pBVar10->vBuf2RootNtk).nCap = 0;
    (pBVar10->vBuf2RootNtk).nSize = 0;
    piVar15 = (pBVar10->vBuf2RootObj).pArray;
    if (piVar15 != (int *)0x0) {
      free(piVar15);
      (pBVar10->vBuf2RootObj).pArray = (int *)0x0;
    }
    (pBVar10->vBuf2RootObj).nCap = 0;
    (pBVar10->vBuf2RootObj).nSize = 0;
    Abc_NamDeref(pBVar10->pStrs);
    Abc_NamDeref(pBVar10->pMods);
    if (pBVar10->pName != (char *)0x0) {
      free(pBVar10->pName);
      pBVar10->pName = (char *)0x0;
    }
    if (pBVar10->pSpec != (char *)0x0) {
      free(pBVar10->pSpec);
      pBVar10->pSpec = (char *)0x0;
    }
    if (pBVar10->pNtks != (Bac_Ntk_t *)0x0) {
      free(pBVar10->pNtks);
    }
    free(pBVar10);
    pBVar10 = (Bac_Man_t *)0x0;
  }
  if (vBox2Id->pArray != (int *)0x0) {
    free(vBox2Id->pArray);
  }
  free(vBox2Id);
  if (vMap->pArray != (int *)0x0) {
    free(vMap->pArray);
  }
  free(vMap);
  return pBVar10;
}

Assistant:

Bac_Man_t * Bac_PtrTransformToCba( Vec_Ptr_t * vDes )
{
    char * pName = (char *)Vec_PtrEntry(vDes, 0);
    Bac_Man_t * pNew = Bac_ManAlloc( pName, Vec_PtrSize(vDes) - 1 );
    Vec_Int_t * vMap = Vec_IntStartFull( 1000 );
    Vec_Int_t * vBox2Id = Vec_IntAlloc( 1000 );
    // create interfaces
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
        Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
        int NameId = Abc_NamStrFindOrAdd( pNew->pStrs, (char *)Vec_PtrEntry(vNtk, 0), NULL );
        Bac_NtkAlloc( pNtk, NameId, Vec_PtrSize(vInputs), Vec_PtrSize(vOutputs), Ptr_ManCountNtk(vNtk) );
        Bac_NtkStartNames( pNtk );
    }
    // parse the networks
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        if ( !Bac_NtkDeriveFromPtr( pNtk, vNtk, vMap, vBox2Id ) )
            break;
    }
    if ( i <= Bac_ManNtkNum(pNew) )
       Bac_ManFree(pNew), pNew = NULL;
    Vec_IntFree( vBox2Id );
    Vec_IntFree( vMap );
    return pNew;
}